

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v7::detail::
       parse_align<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
                 *handler)

{
  char cVar1;
  align_t align;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  basic_string_view<char> fill;
  
  uVar2 = (uint)((byte)*begin >> 3);
  pcVar3 = begin + (ulong)((0x80ff0000U >> uVar2 & 1) != 0) + (long)(char)(&DAT_001246e0)[uVar2];
  if (end <= begin + (ulong)((0x80ff0000U >> uVar2 & 1) != 0) + (long)(char)(&DAT_001246e0)[uVar2])
  {
    pcVar3 = begin;
  }
  do {
    cVar1 = *pcVar3;
    if (cVar1 == '^') {
      align = center;
LAB_001138bc:
      fill.size_ = (long)pcVar3 - (long)begin;
      if (fill.size_ != 0) {
        if (*begin == 0x7b) {
          specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::on_error(&handler->
                      super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     ,"invalid fill character \'{\'");
          return begin;
        }
        fill.data_ = begin;
        specs_setter<char>::on_fill((specs_setter<char> *)handler,fill);
        begin = pcVar3;
      }
      specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
      ::on_align(handler,align);
      return begin + 1;
    }
    if (cVar1 == '>') {
      align = right;
      goto LAB_001138bc;
    }
    if (cVar1 == '<') {
      align = left;
      goto LAB_001138bc;
    }
    bVar4 = pcVar3 == begin;
    pcVar3 = begin;
    if (bVar4) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = begin + code_point_length(begin);
  if (p >= end) p = begin;
  for (;;) {
    switch (to_ascii(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_DEPRECATED_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}